

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall helics::FederateState::timeoutCheck(FederateState *this,ActionMessage *cmd)

{
  ushort uVar1;
  int32_t timerIndex;
  long lVar2;
  MessageTimer *this_00;
  _Alloc_hider _Var3;
  size_type sVar4;
  GlobalFederateId GVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar6;
  size_t sVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  char *pcVar8;
  string_view logMessageSource;
  string_view fmt;
  string_view logMessageSource_00;
  string_view logMessageSource_01;
  string_view query;
  string_view logMessageSource_02;
  string_view fmt_00;
  string_view logMessageSource_03;
  string_view logMessageSource_04;
  string_view fmt_01;
  string_view logMessageSource_05;
  string_view message;
  format_args args;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  format_args args_00;
  string_view message_03;
  string_view message_04;
  format_args args_01;
  string_view message_05;
  pair<helics::GlobalFederateId,_TimeRepresentation<count_time<9,_long>_>_> pVar9;
  string qres;
  ActionMessage brokerTimeoutCheck;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_1f8;
  size_t local_1f0;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_1e8;
  string local_1d8;
  BaseType local_1b8 [4];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_1a8;
  BaseType local_1a0;
  undefined4 uStack_19c;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_198 [11];
  ActionMessage local_e8;
  
  lVar2 = (cmd->actionTime).internalTimeCode;
  if ((this->timeGranted_mode & lVar2 != 0x7fffffffffffffff) != 0) {
    return;
  }
  if (this->mGrantCount != (cmd->dest_handle).hid) {
    return;
  }
  uVar1 = cmd->counter;
  if (uVar1 < 6) {
    if (uVar1 != 0) {
      if (uVar1 == 3) {
        logMessageSource._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
        logMessageSource._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
        message._M_str = "grant timeout stage 2 requesting time resend";
        message._M_len = 0x2c;
        logMessage(this,3,logMessageSource,message,false);
        TimeCoordinator::requestTimeCheck
                  ((this->timeCoord)._M_t.
                   super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                   .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
      }
      goto LAB_002d353a;
    }
    pVar9 = TimeCoordinator::getMinGrantedDependency
                      ((this->timeCoord)._M_t.
                       super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                       .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
    sVar4 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var3 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    GVar5 = pVar9.first.gid;
    if ((GVar5.gid != -2010000000) && (GVar5.gid != -1700000000)) {
      lVar2 = (this->time_granted).internalTimeCode;
      local_1a8 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                  ((double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000));
      fmt_01.size_ = 0x1a;
      fmt_01.data_ = (char *)0x30;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_1a8;
      local_198[0]._0_4_ = GVar5.gid;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&local_1f8,(v11 *)"grant timeout exceeded sim time {} waiting on {}",
                 fmt_01,args_01);
      logMessageSource_05._M_str = _Var3._M_p;
      logMessageSource_05._M_len = sVar4;
      message_05._M_str = (char *)local_1f8.values_;
      message_05._M_len = local_1f0;
      logMessage(this,3,logMessageSource_05,message_05,false);
      goto LAB_002d351f;
    }
    lVar2 = (this->time_granted).internalTimeCode;
    local_1f8 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                ((double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000));
    fmt.size_ = 10;
    fmt.data_ = (char *)0x22;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_1f8;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)&local_1a8,(v11 *)"grant timeout exceeded sim time {}",fmt,args);
    message_00._M_len._4_4_ = uStack_19c;
    message_00._M_len._0_4_ = local_1a0;
    logMessageSource_00._M_str = _Var3._M_p;
    logMessageSource_00._M_len = sVar4;
    message_00._M_str = (char *)local_1a8.values_;
    logMessage(this,3,logMessageSource_00,message_00,false);
    if (&(local_1a8.values_)->field_0 == local_198) goto LAB_002d353a;
    local_1e8.long_long_value = CONCAT44(local_198[0].long_long_value._4_4_,local_198[0].int_value);
    aVar6 = local_1a8;
  }
  else {
    if (uVar1 != 6) {
      if (uVar1 == 10) {
        if (lVar2 == 0x7fffffffffffffff) {
          pcVar8 = "finalize blocking";
          sVar7 = 0x11;
        }
        else {
          pcVar8 = "grant timeout stage 4 error actions (none available)";
          sVar7 = 0x34;
        }
        logMessageSource_04._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
        logMessageSource_04._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
        message_04._M_str = pcVar8;
        message_04._M_len = sVar7;
        logMessage(this,3,logMessageSource_04,message_04,false);
      }
      goto LAB_002d353a;
    }
    logMessageSource_01._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    logMessageSource_01._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    message_01._M_str = "grant timeout stage 3 diagnostics";
    message_01._M_len = 0x21;
    logMessage(this,3,logMessageSource_01,message_01,false);
    query._M_str = "global_time_debugging";
    query._M_len = 0x15;
    processQueryActual_abi_cxx11_((string *)&local_1f8,this,query);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,0,0,
               "TIME DEBUGGING::",0x10);
    logMessageSource_02._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    logMessageSource_02._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    message_02._M_str = (char *)local_1f8.values_;
    message_02._M_len = local_1f0;
    aVar6 = local_1f8;
    logMessage(this,3,logMessageSource_02,message_02,false);
    GVar5 = BaseTimeCoordinator::getParent
                      (&((this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->
                        super_BaseTimeCoordinator);
    if ((GVar5.gid != -2010000000) && (GVar5.gid != -1700000000)) {
      ActionMessage::ActionMessage((ActionMessage *)&local_1a8,cmd);
      local_1a0 = (this->global_id)._M_i.gid;
      local_198[0]._0_4_ = GVar5;
      routeMessage(this,(ActionMessage *)&local_1a8);
      sVar4 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var3 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      fmt_00.size_ = 1;
      fmt_00.data_ = (char *)0x22;
      args_00.field_1.args_ = aVar6.args_;
      args_00.desc_ = (unsigned_long_long)local_1b8;
      local_1b8[0] = GVar5.gid;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_1d8,(v11 *)"sending grant time out check to {}",fmt_00,args_00);
      logMessageSource_03._M_str = _Var3._M_p;
      logMessageSource_03._M_len = sVar4;
      message_03._M_str = local_1d8._M_dataplus._M_p;
      message_03._M_len = local_1d8._M_string_length;
      logMessage(this,3,logMessageSource_03,message_03,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      ActionMessage::~ActionMessage((ActionMessage *)&local_1a8);
    }
LAB_002d351f:
    aVar6 = local_1f8;
    if (&(local_1f8.values_)->field_0 == &local_1e8) goto LAB_002d353a;
  }
  operator_delete(aVar6.values_,(ulong)((long)&(local_1e8.named_args.data)->name + 1));
LAB_002d353a:
  this_00 = (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 != (MessageTimer *)0x0) {
    cmd->counter = cmd->counter + 1;
    timerIndex = this->grantTimeoutTimeIndex;
    lVar2 = (this->grantTimeOutPeriod).internalTimeCode;
    ActionMessage::ActionMessage(&local_e8,cmd);
    MessageTimer::updateTimerFromNow
              (this_00,timerIndex,(nanoseconds)((lVar2 / 1000000) * 1000000),&local_e8);
    ActionMessage::~ActionMessage(&local_e8);
  }
  return;
}

Assistant:

void FederateState::timeoutCheck(ActionMessage& cmd)
{
    if (timeGranted_mode && cmd.actionTime != Time::maxVal()) {
        return;
    }
    if (mGrantCount != static_cast<std::uint32_t>(cmd.getExtraData())) {
        // time has been granted since this was triggered
        return;
    }
    if (cmd.counter == 0) {
        auto blockFed = timeCoord->getMinGrantedDependency();
        if (blockFed.first.isValid()) {
            LOG_WARNING(fmt::format("grant timeout exceeded sim time {} waiting on {}",
                                    static_cast<double>(time_granted),
                                    blockFed.first.baseValue()));
        } else {
            LOG_WARNING(fmt::format("grant timeout exceeded sim time {}",
                                    static_cast<double>(time_granted)));
        }

    } else if (cmd.counter == 3) {
        LOG_WARNING("grant timeout stage 2 requesting time resend");
        timeCoord->requestTimeCheck();
    } else if (cmd.counter == 6) {
        LOG_WARNING("grant timeout stage 3 diagnostics");
        auto qres = processQueryActual("global_time_debugging");
        qres.insert(0, "TIME DEBUGGING::");
        LOG_WARNING(qres);
        auto parentID = timeCoord->getParent();
        if (parentID.isValid()) {
            ActionMessage brokerTimeoutCheck{cmd};
            brokerTimeoutCheck.source_id = global_id.load();
            brokerTimeoutCheck.dest_id = parentID;
            routeMessage(brokerTimeoutCheck);
            LOG_WARNING(fmt::format("sending grant time out check to {}", parentID.baseValue()));
        }
    } else if (cmd.counter == 10) {
        if (cmd.actionTime == Time::maxVal()) {
            LOG_WARNING("finalize blocking");
        } else {
            LOG_WARNING("grant timeout stage 4 error actions (none available)");
        }
    }
#ifndef HELICS_DISABLE_ASIO
    if (mTimer) {
        ++cmd.counter;
        mTimer->updateTimerFromNow(grantTimeoutTimeIndex,
                                   grantTimeOutPeriod.to_ms(),
                                   std::move(cmd));
    }
#endif
}